

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O1

void deqp::gles31::Functional::anon_unknown_0::
     generateBufferVariableMatrixCases<(deqp::gles31::Functional::ProgramResourcePropFlags)64>
               (Context *context,SharedPtr *parentStructure,TestCaseGroup *targetGroup,
               bool extendedTypeCases)

{
  TestNode *pTVar1;
  Node *pNVar2;
  SharedPtrStateBase *pSVar3;
  undefined7 in_register_00000009;
  deInt32 *pdVar4;
  SharedPtr matrixOrder;
  SharedPtr local_58;
  _func_int **local_44 [2];
  MatrixOrder local_34;
  
  if ((int)CONCAT71(in_register_00000009,extendedTypeCases) != 0) {
    pTVar1 = (TestNode *)operator_new(0x78);
    tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)pTVar1,context->m_testCtx,"types","Types");
    pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_021985d0;
    pTVar1[1]._vptr_TestNode = (_func_int **)context;
    tcu::TestNode::addChild(&targetGroup->super_TestNode,pTVar1);
    generateBufferVariableMatrixVariableBasicTypeCases
              (context,parentStructure,(TestCaseGroup *)pTVar1,PROGRAMRESOURCEPROP_MATRIX_ROW_MAJOR)
    ;
  }
  pTVar1 = (TestNode *)operator_new(0x78);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar1,context->m_testCtx,"no_qualifier","No qualifier");
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_021985d0;
  pTVar1[1]._vptr_TestNode = (_func_int **)context;
  tcu::TestNode::addChild(&targetGroup->super_TestNode,pTVar1);
  generateBufferVariableMatrixVariableCases
            (context,parentStructure,(TestCaseGroup *)pTVar1,PROGRAMRESOURCEPROP_MATRIX_ROW_MAJOR);
  pNVar2 = (Node *)operator_new(0x38);
  glu::Layout::Layout((Layout *)local_44,-1,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_COLUMN_MAJOR);
  pNVar2->_vptr_Node = (_func_int **)&PTR__Node_021a6ef8;
  pNVar2->m_type = TYPE_LAYOUT_QUALIFIER;
  (pNVar2->m_enclosingNode).m_ptr = parentStructure->m_ptr;
  pSVar3 = parentStructure->m_state;
  (pNVar2->m_enclosingNode).m_state = pSVar3;
  if (pSVar3 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pSVar3->strongRefCount = pSVar3->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar4 = &((pNVar2->m_enclosingNode).m_state)->weakRefCount;
    *pdVar4 = *pdVar4 + 1;
    UNLOCK();
  }
  pNVar2->_vptr_Node = (_func_int **)&PTR__Node_021a7190;
  pNVar2[1]._vptr_Node = local_44[0];
  *(_func_int ***)&pNVar2[1].m_type = local_44[1];
  *(MatrixOrder *)&pNVar2[1].m_enclosingNode.m_ptr = local_34;
  local_58.m_state = (SharedPtrStateBase *)0x0;
  local_58.m_ptr = pNVar2;
  pSVar3 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar3->strongRefCount = 0;
  pSVar3->weakRefCount = 0;
  pSVar3->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021a6f18;
  pSVar3[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar2;
  pSVar3->strongRefCount = 1;
  pSVar3->weakRefCount = 1;
  local_58.m_state = pSVar3;
  pTVar1 = (TestNode *)operator_new(0x78);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar1,context->m_testCtx,"column_major","Column major qualifier");
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_021985d0;
  pTVar1[1]._vptr_TestNode = (_func_int **)context;
  tcu::TestNode::addChild(&targetGroup->super_TestNode,pTVar1);
  generateBufferVariableMatrixVariableCases
            (context,&local_58,(TestCaseGroup *)pTVar1,PROGRAMRESOURCEPROP_MATRIX_ROW_MAJOR);
  pdVar4 = &pSVar3->strongRefCount;
  LOCK();
  *pdVar4 = *pdVar4 + -1;
  UNLOCK();
  if (*pdVar4 == 0) {
    local_58.m_ptr = (Node *)0x0;
    (*(local_58.m_state)->_vptr_SharedPtrStateBase[2])();
  }
  LOCK();
  pdVar4 = &(local_58.m_state)->weakRefCount;
  *pdVar4 = *pdVar4 + -1;
  UNLOCK();
  if (*pdVar4 == 0) {
    if (local_58.m_state != (SharedPtrStateBase *)0x0) {
      (*(local_58.m_state)->_vptr_SharedPtrStateBase[1])();
    }
    local_58.m_state = (SharedPtrStateBase *)0x0;
  }
  pNVar2 = (Node *)operator_new(0x38);
  glu::Layout::Layout((Layout *)local_44,-1,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_ROW_MAJOR);
  pNVar2->_vptr_Node = (_func_int **)&PTR__Node_021a6ef8;
  pNVar2->m_type = TYPE_LAYOUT_QUALIFIER;
  (pNVar2->m_enclosingNode).m_ptr = parentStructure->m_ptr;
  pSVar3 = parentStructure->m_state;
  (pNVar2->m_enclosingNode).m_state = pSVar3;
  if (pSVar3 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pSVar3->strongRefCount = pSVar3->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar4 = &((pNVar2->m_enclosingNode).m_state)->weakRefCount;
    *pdVar4 = *pdVar4 + 1;
    UNLOCK();
  }
  pNVar2->_vptr_Node = (_func_int **)&PTR__Node_021a7190;
  pNVar2[1]._vptr_Node = local_44[0];
  *(_func_int ***)&pNVar2[1].m_type = local_44[1];
  *(MatrixOrder *)&pNVar2[1].m_enclosingNode.m_ptr = local_34;
  local_58.m_state = (SharedPtrStateBase *)0x0;
  local_58.m_ptr = pNVar2;
  pSVar3 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar3->strongRefCount = 0;
  pSVar3->weakRefCount = 0;
  pSVar3->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021a6f18;
  pSVar3[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar2;
  pSVar3->strongRefCount = 1;
  pSVar3->weakRefCount = 1;
  local_58.m_state = pSVar3;
  pTVar1 = (TestNode *)operator_new(0x78);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar1,context->m_testCtx,"row_major","Row major qualifier");
  pTVar1->_vptr_TestNode = (_func_int **)&PTR__TestCase_021985d0;
  pTVar1[1]._vptr_TestNode = (_func_int **)context;
  tcu::TestNode::addChild(&targetGroup->super_TestNode,pTVar1);
  generateBufferVariableMatrixVariableCases
            (context,&local_58,(TestCaseGroup *)pTVar1,PROGRAMRESOURCEPROP_MATRIX_ROW_MAJOR);
  pdVar4 = &pSVar3->strongRefCount;
  LOCK();
  *pdVar4 = *pdVar4 + -1;
  UNLOCK();
  if (*pdVar4 == 0) {
    local_58.m_ptr = (Node *)0x0;
    (*(local_58.m_state)->_vptr_SharedPtrStateBase[2])();
  }
  LOCK();
  pdVar4 = &(local_58.m_state)->weakRefCount;
  *pdVar4 = *pdVar4 + -1;
  UNLOCK();
  if ((*pdVar4 == 0) && (local_58.m_state != (SharedPtrStateBase *)0x0)) {
    (*(local_58.m_state)->_vptr_SharedPtrStateBase[1])();
  }
  return;
}

Assistant:

static void generateBufferVariableMatrixCases (Context& context, const ResourceDefinition::Node::SharedPtr& parentStructure, tcu::TestCaseGroup* targetGroup, bool extendedTypeCases)
{
	// .types
	if (extendedTypeCases)
	{
		tcu::TestCaseGroup* const blockGroup = new TestCaseGroup(context, "types", "Types");
		targetGroup->addChild(blockGroup);
		generateBufferVariableMatrixVariableBasicTypeCases(context, parentStructure, blockGroup, TargetProp);
	}

	// .no_qualifier
	{
		tcu::TestCaseGroup* const blockGroup = new TestCaseGroup(context, "no_qualifier", "No qualifier");
		targetGroup->addChild(blockGroup);
		generateBufferVariableMatrixVariableCases(context, parentStructure, blockGroup, TargetProp);
	}

	// .column_major
	{
		const ResourceDefinition::Node::SharedPtr matrixOrder(new ResourceDefinition::LayoutQualifier(parentStructure, glu::Layout(-1, -1, -1, glu::FORMATLAYOUT_LAST, glu::MATRIXORDER_COLUMN_MAJOR)));

		tcu::TestCaseGroup* const blockGroup = new TestCaseGroup(context, "column_major", "Column major qualifier");
		targetGroup->addChild(blockGroup);
		generateBufferVariableMatrixVariableCases(context, matrixOrder, blockGroup, TargetProp);
	}

	// .row_major
	{
		const ResourceDefinition::Node::SharedPtr matrixOrder(new ResourceDefinition::LayoutQualifier(parentStructure, glu::Layout(-1, -1, -1, glu::FORMATLAYOUT_LAST, glu::MATRIXORDER_ROW_MAJOR)));

		tcu::TestCaseGroup* const blockGroup = new TestCaseGroup(context, "row_major", "Row major qualifier");
		targetGroup->addChild(blockGroup);
		generateBufferVariableMatrixVariableCases(context, matrixOrder, blockGroup, TargetProp);
	}
}